

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int test_bind_bucket_vip(void)

{
  code *pcVar1;
  char *__s;
  OssAdminBindBucketVipRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_209;
  int ret;
  HttpTestListener *local_1e8;
  HttpTestListener *listener;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [55];
  allocator<char> local_151;
  string local_150 [32];
  OssAdminBindBucketVipRequestType *local_130;
  OssAdmin *ossadmin;
  OssAdminBindBucketVipResponseType resp;
  OssAdminBindBucketVipRequestType req;
  
  aliyun::OssAdminBindBucketVipRequestType::OssAdminBindBucketVipRequestType
            ((OssAdminBindBucketVipRequestType *)((long)&resp.request_id.field_2 + 8));
  aliyun::OssAdminBindBucketVipResponseType::OssAdminBindBucketVipResponseType
            ((OssAdminBindBucketVipResponseType *)&ossadmin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"cn-hangzhou",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"my_appid",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"my_secret",&local_1b1);
  pOVar2 = (OssAdminBindBucketVipRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_150,local_188,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  local_130 = pOVar2;
  if (pOVar2 == (OssAdminBindBucketVipRequestType *)0x0) {
    aliyun::OssAdminBindBucketVipResponseType::~OssAdminBindBucketVipResponseType
              ((OssAdminBindBucketVipResponseType *)&ossadmin);
    aliyun::OssAdminBindBucketVipRequestType::~OssAdminBindBucketVipRequestType
              ((OssAdminBindBucketVipRequestType *)((long)&resp.request_id.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)pOVar2,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetUseTls((OssAdmin *)local_130,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_bind_bucket_vip_response;
  local_1e8 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_209);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_209);
  HttpTestListener::Start(local_1e8);
  std::__cxx11::string::operator=((string *)(resp.request_id.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=((string *)(req.owner_account.field_2._M_local_buf + 8),"Region");
  std::__cxx11::string::operator=((string *)(req.region.field_2._M_local_buf + 8),"VpcId");
  std::__cxx11::string::operator=((string *)(req.vpc_id.field_2._M_local_buf + 8),"Vip");
  std::__cxx11::string::operator=((string *)(req.vip.field_2._M_local_buf + 8),"BucketName");
  aliyun::OssAdmin::BindBucketVip
            (local_130,(OssAdminBindBucketVipResponseType *)((long)&resp.request_id.field_2 + 8),
             (OssAdminErrorInfo *)&ossadmin);
  HttpTestListener::WaitComplete(local_1e8);
  pHVar3 = local_1e8;
  if (local_1e8 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1e8);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_130;
  if (local_130 != (OssAdminBindBucketVipRequestType *)0x0) {
    aliyun::OssAdmin::~OssAdmin((OssAdmin *)local_130);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_bind_bucket_vip() {
  OssAdminBindBucketVipRequestType req;
  OssAdminBindBucketVipResponseType resp;
  OssAdmin* ossadmin = OssAdmin::CreateOssAdminClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ossadmin) return 0;
  ossadmin->SetProxyHost("127.0.0.1:12234");
  ossadmin->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_bind_bucket_vip_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.region = "Region";
  req.vpc_id = "VpcId";
  req.vip = "Vip";
  req.bucket_name = "BucketName";
  int ret = ossadmin->BindBucketVip(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ossadmin;
}